

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char,char_const*&,char_const(&)[7],char_const*,char_const(&)[18],char_const*&,char_const(&)[7]>
          (Exception *this,char **args,char *args_1,int *args_2,char *args_3,char **args_4,
          char (*args_5) [7],char **args_6,char (*args_7) [18],char **args_8,char (*args_9) [7])

{
  string *in_RDI;
  ostringstream oss;
  ostringstream *this_00;
  char *in_stack_fffffffffffffe08;
  char **in_stack_fffffffffffffe10;
  ostringstream *in_stack_fffffffffffffe18;
  Exception *in_stack_fffffffffffffe20;
  ostringstream local_1c8 [8];
  char **in_stack_fffffffffffffe40;
  char (*in_stack_fffffffffffffe48) [7];
  char **in_stack_fffffffffffffe50;
  char (*in_stack_fffffffffffffe58) [18];
  char **in_stack_fffffffffffffe60;
  char (*in_stack_fffffffffffffe68) [7];
  
  this_00 = local_1c8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  SetWhat<char_const*&,char,int&,char,char_const*&,char_const(&)[7],char_const*,char_const(&)[18],char_const*&,char_const(&)[7]>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,(int *)this_00,(char *)in_RDI,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(in_RDI,(string *)&stack0xfffffffffffffe08);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
  std::__cxx11::ostringstream::~ostringstream(local_1c8);
  return;
}

Assistant:

void SetWhat(Args&&... args)
        {
            std::ostringstream oss;
            SetWhat(oss, std::forward<Args>(args)...);
            what_ = oss.str();
        }